

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall
QConfFileSettingsPrivate::QConfFileSettingsPrivate
          (QConfFileSettingsPrivate *this,QString *fileName,Format format)

{
  QConfFileSettingsPrivate *in_RSI;
  long *in_RDI;
  bool in_stack_00000027;
  QString *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffa8;
  Format in_stack_ffffffffffffffac;
  QSettingsPrivate *in_stack_ffffffffffffffb0;
  
  QSettingsPrivate::QSettingsPrivate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  *in_RDI = (long)&PTR__QConfFileSettingsPrivate_00bebf28;
  QList<QConfFile_*>::QList((QList<QConfFile_*> *)0x7ac959);
  QString::QString((QString *)0x7ac96f);
  in_RDI[0x26] = 0x40000000;
  initFormat(in_RSI);
  QConfFile::fromName(in_stack_00000028,in_stack_00000027);
  QList<QConfFile_*>::append
            ((QList<QConfFile_*> *)0x7ac9bb,
             (parameter_type)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  (**(code **)(*in_RDI + 0x68))();
  return;
}

Assistant:

QConfFileSettingsPrivate::QConfFileSettingsPrivate(const QString &fileName,
                                                   QSettings::Format format)
    : QSettingsPrivate(format),
      nextPosition(0x40000000) // big positive number
{
    initFormat();

    confFiles.append(QConfFile::fromName(fileName, true));

    initAccess();
}